

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O0

t_define<xemmai::t_threading> * __thiscall
xemmai::t_define<xemmai::t_threading>::operator()
          (t_define<xemmai::t_threading> *this,t_object *a_name,t_function a_function)

{
  t_global *a_library;
  t_object *local_30;
  t_object *local_28;
  t_function local_20;
  t_function a_function_local;
  t_object *a_name_local;
  t_define<xemmai::t_threading> *this_local;
  
  local_20 = a_function;
  a_function_local = (t_function)a_name;
  a_name_local = (t_object *)this;
  a_library = f_global();
  local_30 = t_object::f_of(this->v_library);
  local_28 = f_new<xemmai::t_native,xemmai::t_global,void(*&)(xemmai::t_library*,xemmai::t_value<xemmai::t_pointer>*,unsigned_long),xemmai::t_object*>
                       (a_library,
                        (_func_void_t_library_ptr_t_value<xemmai::t_pointer>_ptr_unsigned_long **)
                        &local_20,&local_30);
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_object*>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&(this->v_fields).v_class,(t_object **)&a_function_local,&local_28);
  return this;
}

Assistant:

t_define& operator()(t_object* a_name, t_library::t_function a_function)
	{
		v_fields.v_class.emplace_back(a_name, f_new<t_native>(f_global(), a_function, t_object::f_of(v_library)));
		return *this;
	}